

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedPipelineGenDrawCommands::Cleanup
          (AdvancedPipelineGenDrawCommands *this)

{
  CallLogWrapper *this_00;
  RenderTarget *pRVar1;
  int i;
  long lVar2;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  lVar2 = 0;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  do {
    glu::CallLogWrapper::glDeleteProgram(this_00,this->m_program[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_vertex_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_index_buffer);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&this->m_vertex_array);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_draw_buffer);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&this->m_object_buffer);
  pRVar1 = (this->super_ComputeShaderBase).renderTarget;
  glu::CallLogWrapper::glViewport(this_00,0,0,pRVar1->m_width,pRVar1->m_height);
  return 0;
}

Assistant:

virtual long Cleanup()
	{
		glUseProgram(0);
		for (int i = 0; i < 2; ++i)
			glDeleteProgram(m_program[i]);
		glDeleteBuffers(1, &m_vertex_buffer);
		glDeleteBuffers(1, &m_index_buffer);
		glDeleteVertexArrays(1, &m_vertex_array);
		glDeleteBuffers(1, &m_draw_buffer);
		glDeleteBuffers(1, &m_object_buffer);
		glViewport(0, 0, getWindowWidth(), getWindowHeight());
		return NO_ERROR;
	}